

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O1

int __thiscall
adios2::helper::CommImplMPI::Win_shared_query
          (CommImplMPI *this,Win *win,int rank,size_t *size,int *disp_unit,void *baseptr,
          string *hint)

{
  int value;
  undefined8 uVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  size_t local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar1 = adios2::helper::CommWinImpl::Get(win);
  lVar2 = __dynamic_cast(uVar1,&CommWinImpl::typeinfo,&CommWinImplMPI::typeinfo,0);
  value = MPI_Win_shared_query(*(undefined8 *)(lVar2 + 8),rank,&local_70,disp_unit,baseptr);
  std::operator+(&local_48,"in call to Win_shared_query ",hint);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68.field_2._8_8_ = plVar3[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_68._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  anon_unknown_1::CheckMPIReturn(value,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  *size = local_70;
  return value;
}

Assistant:

int CommImplMPI::Win_shared_query(Comm::Win &win, int rank, size_t *size, int *disp_unit,
                                  void *baseptr, const std::string &hint) const
{
    CommWinImplMPI *w = dynamic_cast<CommWinImplMPI *>(CommWinImpl::Get(win));
    MPI_Aint asize;
    int ret = MPI_Win_shared_query(w->m_Win, rank, &asize, disp_unit, baseptr);
    CheckMPIReturn(ret, "in call to Win_shared_query " + hint + "\n");
    *size = static_cast<size_t>(asize);
    return ret;
}